

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

pair<unsigned_long,_unsigned_long>
httplib::detail::get_range_offset_and_length(Request *req,size_t content_length,size_t index)

{
  const_reference pvVar1;
  pair<int,_unsigned_long> pVar2;
  long local_70;
  pair<long,_long> local_68;
  int local_54;
  pair<int,_unsigned_long> local_50;
  long local_40;
  value_type r;
  size_t index_local;
  size_t content_length_local;
  Request *req_local;
  
  r.second = index;
  index_local = content_length;
  content_length_local = (size_t)req;
  pvVar1 = std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::operator[]
                     (&req->ranges,index);
  local_40 = pvVar1->first;
  r.first = pvVar1->second;
  if ((local_40 == -1) && (r.first == -1)) {
    local_54 = 0;
    pVar2 = std::make_pair<int,unsigned_long&>(&local_54,&index_local);
    local_50.second = pVar2.second;
    local_50.first = pVar2.first;
    std::pair<unsigned_long,_unsigned_long>::pair<int,_unsigned_long,_true>
              ((pair<unsigned_long,_unsigned_long> *)&req_local,&local_50);
  }
  else {
    if (local_40 == -1) {
      local_40 = index_local - r.first;
      r.first = index_local - 1;
    }
    if (r.first == -1) {
      r.first = index_local - 1;
    }
    local_70 = (r.first - local_40) + 1;
    local_68 = std::make_pair<long&,long>(&local_40,&local_70);
    std::pair<unsigned_long,_unsigned_long>::pair<long,_long,_true>
              ((pair<unsigned_long,_unsigned_long> *)&req_local,&local_68);
  }
  return _req_local;
}

Assistant:

inline std::pair<size_t, size_t>
get_range_offset_and_length(const Request &req, size_t content_length,
                            size_t index) {
  auto r = req.ranges[index];

  if (r.first == -1 && r.second == -1) {
    return std::make_pair(0, content_length);
  }

  if (r.first == -1) {
    r.first = content_length - r.second;
    r.second = content_length - 1;
  }

  if (r.second == -1) { r.second = content_length - 1; }

  return std::make_pair(r.first, r.second - r.first + 1);
}